

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mt.c
# Opt level: O0

char * sylvan_mt_to_str(int complement,uint32_t type,uint64_t value,char *buf,size_t buflen)

{
  int iVar1;
  uint uVar2;
  customleaf_t *pcVar3;
  char *local_70;
  char *ptr_2;
  size_t required_2;
  uint32_t denom;
  int32_t num;
  char *ptr_1;
  size_t required_1;
  char *ptr;
  size_t required;
  customleaf_t *c;
  size_t buflen_local;
  char *buf_local;
  uint64_t value_local;
  uint32_t type_local;
  int complement_local;
  
  if (type < cl_registry_count) {
    if (type == 0) {
      iVar1 = snprintf((char *)0x0,0,"%ld",value);
      pcVar3 = (customleaf_t *)(long)iVar1;
      required_1 = (size_t)buf;
      c = (customleaf_t *)buflen;
      if (buflen < pcVar3) {
        required_1 = (size_t)malloc((size_t)pcVar3);
        c = pcVar3;
      }
      if (required_1 != 0) {
        snprintf((char *)required_1,(size_t)c,"%ld",value);
      }
      _type_local = (char *)required_1;
    }
    else if (type == 1) {
      iVar1 = snprintf((char *)0x0,0,"%f",value);
      pcVar3 = (customleaf_t *)(long)iVar1;
      _denom = buf;
      c = (customleaf_t *)buflen;
      if (buflen < pcVar3) {
        _denom = (char *)malloc((size_t)pcVar3);
        c = pcVar3;
      }
      if (_denom != (char *)0x0) {
        snprintf(_denom,(size_t)c,"%f",value);
      }
      _type_local = _denom;
    }
    else if (type == 2) {
      uVar2 = (uint)(value >> 0x20);
      iVar1 = snprintf((char *)0x0,0,"%d/%u",(ulong)uVar2,value & 0xffffffff);
      pcVar3 = (customleaf_t *)(long)iVar1;
      local_70 = buf;
      c = (customleaf_t *)buflen;
      if (buflen < pcVar3) {
        local_70 = (char *)malloc((size_t)pcVar3);
        c = pcVar3;
      }
      if (local_70 != (char *)0x0) {
        snprintf(local_70,(size_t)c,"%d/%u",(ulong)uVar2,value & 0xffffffff);
      }
      _type_local = local_70;
    }
    else if (cl_registry[type].to_str_cb == (sylvan_mt_to_str_cb)0x0) {
      _type_local = (char *)0x0;
    }
    else {
      _type_local = (*cl_registry[type].to_str_cb)(complement,value,buf,buflen);
    }
    return _type_local;
  }
  __assert_fail("type < cl_registry_count",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mt.c"
                ,0xc6,"char *sylvan_mt_to_str(int, uint32_t, uint64_t, char *, size_t)");
}

Assistant:

char*
sylvan_mt_to_str(int complement, uint32_t type, uint64_t value, char* buf, size_t buflen)
{
    assert(type < cl_registry_count);
    customleaf_t *c = cl_registry + type;
    if (type == 0) {
        size_t required = (size_t)snprintf(NULL, 0, "%" PRId64, (int64_t)value);
        char *ptr = buf;
        if (buflen < required) {
            ptr = (char*)malloc(required);
            buflen = required;
        }
        if (ptr != NULL) snprintf(ptr, buflen, "%" PRId64, (int64_t)value);
        return ptr;
    } else if (type == 1) {
        size_t required = (size_t)snprintf(NULL, 0, "%f", *(double*)&value);
        char *ptr = buf;
        if (buflen < required) {
            ptr = (char*)malloc(required);
            buflen = required;
        }
        if (ptr != NULL) snprintf(ptr, buflen, "%f", *(double*)&value);
        return ptr;
    } else if (type == 2) {
        int32_t num = (int32_t)(value>>32);
        uint32_t denom = value&0xffffffff;
        size_t required = (size_t)snprintf(NULL, 0, "%" PRId32 "/%" PRIu32, num, denom);
        char *ptr = buf;
        if (buflen < required) {
            ptr = (char*)malloc(required);
            buflen = required;
        }
        if (ptr != NULL) snprintf(ptr, buflen, "%" PRId32 "/%" PRIu32, num, denom);
        return ptr;
    } else if (c->to_str_cb != NULL) {
        return c->to_str_cb(complement, value, buf, buflen);
    } else {
        return NULL;
    }
}